

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jitshared.c
# Opt level: O2

void emit_op_arithslow(function *fn,int A,int B,int C,OpCode op,int pc,char *opchar,char *tm)

{
  membuff_t *mb;
  undefined4 in_register_0000008c;
  
  emit_reg(fn,"ra",A);
  emit_reg_or_k(fn,"rb",B);
  emit_reg_or_k(fn,"rc",C);
  mb = &fn->body;
  membuff_add_string(mb,"if (ttisinteger(rb) && ttisinteger(rc)) {\n");
  membuff_add_string(mb," i = ivalue(rb);\n");
  membuff_add_string(mb," ic = ivalue(rc);\n");
  membuff_add_fstring(mb," setivalue(ra, (i %s ic));\n",CONCAT44(in_register_0000008c,pc));
  membuff_add_string(mb,"} else if (tonumberns(rb, n) && tonumberns(rc, nc)) {\n");
  membuff_add_fstring(mb," setfltvalue(ra, (n %s nc));\n",CONCAT44(in_register_0000008c,pc));
  membuff_add_string(mb,"} else {\n");
  emit_update_savedpc(fn,op);
  membuff_add_fstring(mb," luaT_trybinTM(L, rb, rc, ra, %s);\n",opchar);
  membuff_add_string(mb," base = ci->u.l.base;\n");
  membuff_add_string(mb,"}\n");
  return;
}

Assistant:

static void emit_op_arithslow(struct function *fn, int A, int B, int C, OpCode op, int pc, const char *opchar,
                              const char *tm) {
  (void)op;
  emit_reg(fn, "ra", A);
  emit_reg_or_k(fn, "rb", B);
  emit_reg_or_k(fn, "rc", C);
  membuff_add_string(&fn->body, "if (ttisinteger(rb) && ttisinteger(rc)) {\n");
  membuff_add_string(&fn->body, " i = ivalue(rb);\n");
  membuff_add_string(&fn->body, " ic = ivalue(rc);\n");
  membuff_add_fstring(&fn->body, " setivalue(ra, (i %s ic));\n", opchar);
  membuff_add_string(&fn->body, "} else if (tonumberns(rb, n) && tonumberns(rc, nc)) {\n");
  membuff_add_fstring(&fn->body, " setfltvalue(ra, (n %s nc));\n", opchar);
  membuff_add_string(&fn->body, "} else {\n");
  emit_update_savedpc(fn, pc);
  membuff_add_fstring(&fn->body, " luaT_trybinTM(L, rb, rc, ra, %s);\n", tm);
  membuff_add_string(&fn->body, " base = ci->u.l.base;\n");
  membuff_add_string(&fn->body, "}\n");
}